

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

int op_update(lua_State *L)

{
  int off;
  uint32_t uVar1;
  uint32_t uVar2;
  char *key;
  lua_Integer lVar3;
  int total;
  int32_t update_len;
  int32_t selector_len;
  int len;
  buffer buf;
  luaL_Buffer b;
  char *name;
  size_t sz;
  document update;
  document selector;
  lua_State *L_local;
  
  selector = L;
  update = lua_touserdata(L,3);
  sz = (size_t)lua_touserdata((lua_State *)selector,4);
  if ((update == (document)0x0) || ((void *)sz == (void *)0x0)) {
    luaL_error((lua_State *)selector,"Invalid param");
  }
  name = (char *)0x0;
  key = luaL_checklstring((lua_State *)selector,1,(size_t *)&name);
  luaL_buffinit((lua_State *)selector,(luaL_Buffer *)(buf.buffer + 0x78));
  buffer_create((buffer *)&selector_len);
  off = reserve_length((buffer *)&selector_len);
  write_int32((buffer *)&selector_len,0);
  write_int32((buffer *)&selector_len,0);
  write_int32((buffer *)&selector_len,0x7d1);
  write_int32((buffer *)&selector_len,0);
  write_string((buffer *)&selector_len,key,(size_t)name);
  lVar3 = lua_tointegerx((lua_State *)selector,2,(int *)0x0);
  write_int32((buffer *)&selector_len,(int32_t)lVar3);
  uVar1 = get_length(update);
  uVar2 = get_length((document)sz);
  write_length((buffer *)&selector_len,selector_len + uVar1 + uVar2,off);
  luaL_addlstring((luaL_Buffer *)(buf.buffer + 0x78),(char *)buf._0_8_,(long)selector_len);
  buffer_destroy((buffer *)&selector_len);
  luaL_addlstring((luaL_Buffer *)(buf.buffer + 0x78),(char *)update,(long)(int)uVar1);
  luaL_addlstring((luaL_Buffer *)(buf.buffer + 0x78),(char *)sz,(long)(int)uVar2);
  luaL_pushresult((luaL_Buffer *)(buf.buffer + 0x78));
  return 1;
}

Assistant:

static int
op_update(lua_State *L) {
	document selector  = lua_touserdata(L,3);
	document update = lua_touserdata(L,4);
	if (selector == NULL || update == NULL) {
		luaL_error(L, "Invalid param");
	}
	size_t sz = 0;
	const char * name = luaL_checklstring(L,1,&sz);

	luaL_Buffer b;
	luaL_buffinit(L, &b);

	struct buffer buf;
	buffer_create(&buf);
		// make package header, don't raise L error
		int len = reserve_length(&buf);
		write_int32(&buf, 0);
		write_int32(&buf, 0);
		write_int32(&buf, OP_UPDATE);
		write_int32(&buf, 0);
		write_string(&buf, name, sz);
		write_int32(&buf, lua_tointeger(L,2));

		int32_t selector_len = get_length(selector);
		int32_t update_len = get_length(update);

		int total = buf.size + selector_len + update_len;
		write_length(&buf, total, len);

		luaL_addlstring(&b, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	luaL_addlstring(&b, (const char *)selector, selector_len);
	luaL_addlstring(&b, (const char *)update, update_len);

	luaL_pushresult(&b);

	return 1;
}